

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O3

void Saig_ManCbaShrink(Saig_ManCba_t *p)

{
  size_t __size;
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  void **ppvVar6;
  void *pvVar7;
  Aig_Man_t *p_00;
  int iVar8;
  Vec_Vec_t *pVVar9;
  int *piVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  
  pVVar9 = p->vReg2Frame;
  if (0 < pVVar9->nSize) {
    lVar12 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar12];
      iVar5 = *(int *)((long)pvVar3 + 4);
      if (1 < iVar5) {
        __size = lVar12 * 8 + 8;
        iVar8 = (int)(lVar12 + 1U);
        lVar15 = 0;
        do {
          uVar1 = *(uint *)(*(long *)((long)pvVar3 + 8) + 4 + lVar15 * 4);
          if ((int)uVar1 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          pVVar4 = p->pFrames->vObjs;
          if (pVVar4 != (Vec_Ptr_t *)0x0) {
            if (pVVar4->nSize <= (int)(uVar1 >> 1)) {
LAB_006183f9:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar7 = pVVar4->pArray[uVar1 >> 1];
            if (pvVar7 != (void *)0x0) {
              if (((ulong)pvVar7 & 1) != 0) {
                __assert_fail("!Aig_IsComplement(pObj)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                              ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
              }
              uVar2 = *(uint *)(*(long *)((long)pvVar3 + 8) + lVar15 * 4);
              uVar16 = *(ulong *)((long)pvVar7 + 0x18);
              if ((((uint)uVar16 & 7) == 1) ||
                 (*(int *)((long)pvVar7 + 0x20) == p->pFrames->nTravIds)) {
                pVVar4 = p->pAig->vObjs;
                if (pVVar4 == (Vec_Ptr_t *)0x0) {
                  piVar10 = (int *)0x0;
                }
                else {
                  if (((int)uVar2 < 0) || (pVVar4->nSize <= (int)uVar2)) goto LAB_006183f9;
                  piVar10 = (int *)pVVar4->pArray[uVar2];
                }
                if ((piVar10[6] & 7U) != 3) {
LAB_00618418:
                  __assert_fail("Saig_ObjIsLi(p->pAig, pObjLi)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/abs/absOldCex.c"
                                ,0x23a,"void Saig_ManCbaShrink(Saig_ManCba_t *)");
                }
                iVar5 = p->pAig->nTruePos;
                iVar11 = *piVar10 - iVar5;
                if (*piVar10 < iVar5) goto LAB_00618418;
                if (iVar11 < 0) {
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                pVVar9 = p->vReg2Value;
                uVar13 = (ulong)pVVar9->nSize;
                if ((long)uVar13 <= lVar12) {
                  if (pVVar9->nCap <= lVar12) {
                    if (pVVar9->pArray == (void **)0x0) {
                      ppvVar6 = (void **)malloc(__size);
                    }
                    else {
                      ppvVar6 = (void **)realloc(pVVar9->pArray,__size);
                      uVar13 = (ulong)pVVar9->nSize;
                    }
                    pVVar9->pArray = ppvVar6;
                    pVVar9->nCap = iVar8;
                  }
                  if ((long)uVar13 <= lVar12) {
                    do {
                      uVar14 = uVar13 + 1;
                      pvVar7 = calloc(1,0x10);
                      pVVar9->pArray[uVar13] = pvVar7;
                      uVar13 = uVar14;
                    } while (lVar12 + 1U != (uVar14 & 0xffffffff));
                  }
                  pVVar9->nSize = iVar8;
                  uVar13 = (long)iVar8;
                }
                if ((long)uVar13 <= lVar12) goto LAB_00618456;
                Vec_IntPush((Vec_Int_t *)pVVar9->pArray[lVar12],
                            ((uint)((uVar16 & 8) == 0) ^ uVar1 & 1) + iVar11 * 2);
                iVar5 = *(int *)((long)pvVar3 + 4);
              }
            }
          }
          lVar15 = lVar15 + 2;
        } while ((int)((uint)lVar15 | 1) < iVar5);
        pVVar9 = p->vReg2Frame;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar9->nSize);
    if (0 < pVVar9->nSize) {
      uVar16 = 0;
      do {
        if ((long)p->vReg2Value->nSize <= (long)uVar16) {
LAB_00618456:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                        ,0x116,"Vec_Int_t *Vec_VecEntryInt(Vec_Vec_t *, int)");
        }
        dVar17 = (double)p->pAig->nRegs;
        printf("Level = %4d   StateBits = %4d (%6.2f %%)  CareBits = %4d (%6.2f %%)\n",
               ((double)(*(int *)((long)pVVar9->pArray[uVar16] + 4) / 2) * 100.0) / dVar17,
               ((double)*(int *)((long)p->vReg2Value->pArray[uVar16] + 4) * 100.0) / dVar17,
               uVar16 & 0xffffffff);
        uVar16 = uVar16 + 1;
        pVVar9 = p->vReg2Frame;
      } while ((long)uVar16 < (long)pVVar9->nSize);
    }
  }
  p_00 = Saig_ManDupWithCubes(p->pAig,p->vReg2Value);
  Aig_ManStop(p_00);
  return;
}

Assistant:

void Saig_ManCbaShrink( Saig_ManCba_t * p )
{
    Aig_Man_t * pManNew;
    Aig_Obj_t * pObjLi, * pObjFrame;
    Vec_Int_t * vLevel, * vLevel2;
    int f, k, ObjId, Lit;
    // assuming that important objects are labeled in Saig_ManCbaFindReason()
    Vec_VecForEachLevelInt( p->vReg2Frame, vLevel, f )
    {
        Vec_IntForEachEntryDouble( vLevel, ObjId, Lit, k )
        {
            pObjFrame = Aig_ManObj( p->pFrames, Abc_Lit2Var(Lit) );
            if ( pObjFrame == NULL || (!Aig_ObjIsConst1(pObjFrame) && !Aig_ObjIsTravIdCurrent(p->pFrames, pObjFrame)) )
                continue;
            pObjLi = Aig_ManObj( p->pAig, ObjId );
            assert( Saig_ObjIsLi(p->pAig, pObjLi) );
            Vec_VecPushInt( p->vReg2Value, f, Abc_Var2Lit( Aig_ObjCioId(pObjLi) - Saig_ManPoNum(p->pAig), Abc_LitIsCompl(Lit) ^ !pObjFrame->fPhase ) );
        }
    }
    // print statistics
    Vec_VecForEachLevelInt( p->vReg2Frame, vLevel, k )
    {
        vLevel2 = Vec_VecEntryInt( p->vReg2Value, k );
        printf( "Level = %4d   StateBits = %4d (%6.2f %%)  CareBits = %4d (%6.2f %%)\n", k, 
            Vec_IntSize(vLevel)/2, 100.0 * (Vec_IntSize(vLevel)/2) / Aig_ManRegNum(p->pAig),
            Vec_IntSize(vLevel2),  100.0 * Vec_IntSize(vLevel2) / Aig_ManRegNum(p->pAig) );
    }
    // try reducing the frames
    pManNew = Saig_ManDupWithCubes( p->pAig, p->vReg2Value );
//    Ioa_WriteAiger( pManNew, "aigcube.aig", 0, 0 );
    Aig_ManStop( pManNew );
}